

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O2

VkBufferMemoryBarrier * __thiscall
myvk::BufferBase::GetMemoryBarrier
          (VkBufferMemoryBarrier *__return_storage_ptr__,BufferBase *this,
          BufferSubresourceRange *region,VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask
          ,uint32_t src_queue_family,uint32_t dst_queue_family)

{
  VkDeviceSize VVar1;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  __return_storage_ptr__->buffer = this->m_buffer;
  VVar1 = region->size;
  __return_storage_ptr__->offset = region->offset;
  __return_storage_ptr__->size = VVar1;
  __return_storage_ptr__->srcAccessMask = src_access_mask;
  __return_storage_ptr__->dstAccessMask = dst_access_mask;
  __return_storage_ptr__->srcQueueFamilyIndex = src_queue_family;
  __return_storage_ptr__->dstQueueFamilyIndex = dst_queue_family;
  return __return_storage_ptr__;
}

Assistant:

VkBufferMemoryBarrier BufferBase::GetMemoryBarrier(const BufferSubresourceRange &region, VkAccessFlags src_access_mask,
                                                   VkAccessFlags dst_access_mask, uint32_t src_queue_family,
                                                   uint32_t dst_queue_family) const {
	VkBufferMemoryBarrier ret = {};
	ret.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
	ret.size = region.size;

	ret.buffer = m_buffer;
	ret.offset = region.offset;
	ret.srcAccessMask = src_access_mask;
	ret.dstAccessMask = dst_access_mask;
	ret.srcQueueFamilyIndex = src_queue_family;
	ret.dstQueueFamilyIndex = dst_queue_family;
	return ret;
}